

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  ushort uVar1;
  short sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  char cVar6;
  stbi__uint16 sVar7;
  stbi__uint32 sVar8;
  stbi__uint32 x_00;
  stbi__uint32 sVar9;
  uint uVar10;
  stbi_uc *psVar11;
  char *pcVar12;
  stbi__uint16 *data;
  stbi__uint16 *psVar13;
  int iVar14;
  ulong uVar15;
  uint pixelCount;
  ulong uVar16;
  ulong uVar17;
  stbi__uint16 *psVar18;
  long lVar19;
  uint uVar20;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar32;
  int iVar33;
  undefined1 auVar27 [16];
  int iVar34;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  float fVar85;
  int iVar92;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  stbi__uint16 *local_80;
  stbi__uint16 *local_70;
  
  sVar8 = stbi__get32be(s);
  if (sVar8 != 0x38425053) {
    pcVar12 = "not PSD";
    goto LAB_00135d2f;
  }
  sVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  if (CONCAT11(sVar3,sVar4) != 1) {
    pcVar12 = "wrong version";
    goto LAB_00135d2f;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar11 = s->img_buffer;
LAB_00135cce:
    s->img_buffer = psVar11 + 6;
  }
  else {
    psVar11 = s->img_buffer;
    iVar14 = (int)s->img_buffer_end - (int)psVar11;
    if (5 < iVar14) goto LAB_00135cce;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar14);
  }
  sVar3 = stbi__get8(s);
  bVar5 = stbi__get8(s);
  uVar20 = (uint)CONCAT11(sVar3,bVar5);
  if (0x10 < uVar20) {
    pcVar12 = "wrong channel count";
    goto LAB_00135d2f;
  }
  sVar8 = stbi__get32be(s);
  x_00 = stbi__get32be(s);
  if (((int)sVar8 < 0x1000001) && ((int)x_00 < 0x1000001)) {
    sVar3 = stbi__get8(s);
    sVar4 = stbi__get8(s);
    sVar2 = CONCAT11(sVar3,sVar4);
    if ((sVar2 != 8) && (sVar2 != 0x10)) {
      pcVar12 = "unsupported bit depth";
      goto LAB_00135d2f;
    }
    sVar3 = stbi__get8(s);
    sVar4 = stbi__get8(s);
    if (CONCAT11(sVar3,sVar4) != 3) {
      pcVar12 = "wrong color format";
      goto LAB_00135d2f;
    }
    sVar9 = stbi__get32be(s);
    stbi__skip(s,sVar9);
    sVar9 = stbi__get32be(s);
    stbi__skip(s,sVar9);
    sVar9 = stbi__get32be(s);
    stbi__skip(s,sVar9);
    uVar10 = stbi__get16be(s);
    if (1 < uVar10) {
      pcVar12 = "bad compression";
      goto LAB_00135d2f;
    }
    iVar14 = stbi__mad3sizes_valid(4,x_00,sVar8,0);
    if (iVar14 != 0) {
      if (((bpc == 0x10) && (sVar2 == 0x10)) && (uVar10 == 0)) {
        data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,sVar8,0);
        ri->bits_per_channel = 0x10;
      }
      else {
        data = (stbi__uint16 *)malloc((long)(int)(sVar8 * x_00 * 4));
      }
      if (data != (stbi__uint16 *)0x0) {
        pixelCount = x_00 * sVar8;
        uVar17 = (ulong)pixelCount;
        if (uVar10 == 0) {
          lVar19 = uVar17 - 1;
          auVar23._8_4_ = (int)lVar19;
          auVar23._0_8_ = lVar19;
          auVar23._12_4_ = (int)((ulong)lVar19 >> 0x20);
          psVar18 = data + 0x1e;
          psVar13 = data + 0x1c;
          uVar16 = 0;
          auVar100._8_4_ = 0xffffffff;
          auVar100._0_8_ = 0xffffffffffffffff;
          auVar100._12_4_ = 0xffffffff;
          auVar93 = _DAT_0015b090;
          local_80 = data;
          local_70 = data;
          do {
            if (uVar16 < uVar20) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < (int)pixelCount) {
                  lVar19 = 0;
                  do {
                    sVar3 = stbi__get8(s);
                    sVar4 = stbi__get8(s);
                    auVar93 = _DAT_0015b090;
                    auVar100._8_4_ = 0xffffffff;
                    auVar100._0_8_ = 0xffffffffffffffff;
                    auVar100._12_4_ = 0xffffffff;
                    local_70[lVar19 * 4] = CONCAT11(sVar3,sVar4);
                    lVar19 = lVar19 + 1;
                  } while (pixelCount != (uint)lVar19);
                }
              }
              else if (sVar2 == 0x10) {
                if (0 < (int)pixelCount) {
                  lVar19 = 0;
                  do {
                    sVar3 = stbi__get8(s);
                    stbi__get8(s);
                    auVar93 = _DAT_0015b090;
                    auVar100._8_4_ = 0xffffffff;
                    auVar100._0_8_ = 0xffffffffffffffff;
                    auVar100._12_4_ = 0xffffffff;
                    *(stbi_uc *)(local_80 + lVar19 * 2) = sVar3;
                    lVar19 = lVar19 + 1;
                  } while (pixelCount != (uint)lVar19);
                }
              }
              else if (0 < (int)pixelCount) {
                lVar19 = 0;
                do {
                  sVar3 = stbi__get8(s);
                  auVar93 = _DAT_0015b090;
                  auVar100._8_4_ = 0xffffffff;
                  auVar100._0_8_ = 0xffffffffffffffff;
                  auVar100._12_4_ = 0xffffffff;
                  *(stbi_uc *)(local_80 + lVar19 * 2) = sVar3;
                  lVar19 = lVar19 + 1;
                } while (pixelCount != (uint)lVar19);
              }
            }
            else if (sVar2 == 0x10 && bpc == 0x10) {
              if (0 < (int)pixelCount) {
                sVar7 = -(ushort)(uVar16 == 3);
                uVar15 = 0;
                do {
                  auVar24._8_4_ = (int)uVar15;
                  auVar24._0_8_ = uVar15;
                  auVar24._12_4_ = (int)(uVar15 >> 0x20);
                  auVar29 = auVar23 ^ auVar93;
                  auVar48 = (auVar24 | _DAT_0015b0b0) ^ auVar93;
                  iVar14 = auVar29._0_4_;
                  iVar84 = -(uint)(iVar14 < auVar48._0_4_);
                  iVar32 = auVar29._4_4_;
                  auVar50._4_4_ = -(uint)(iVar32 < auVar48._4_4_);
                  iVar33 = auVar29._8_4_;
                  iVar92 = -(uint)(iVar33 < auVar48._8_4_);
                  iVar34 = auVar29._12_4_;
                  auVar50._12_4_ = -(uint)(iVar34 < auVar48._12_4_);
                  auVar75._4_4_ = iVar84;
                  auVar75._0_4_ = iVar84;
                  auVar75._8_4_ = iVar92;
                  auVar75._12_4_ = iVar92;
                  auVar29 = pshuflw(in_XMM5,auVar75,0xe8);
                  auVar49._4_4_ = -(uint)(auVar48._4_4_ == iVar32);
                  auVar49._12_4_ = -(uint)(auVar48._12_4_ == iVar34);
                  auVar49._0_4_ = auVar49._4_4_;
                  auVar49._8_4_ = auVar49._12_4_;
                  auVar98 = pshuflw(in_XMM6,auVar49,0xe8);
                  auVar50._0_4_ = auVar50._4_4_;
                  auVar50._8_4_ = auVar50._12_4_;
                  auVar48 = pshuflw(auVar29,auVar50,0xe8);
                  auVar48 = (auVar48 | auVar98 & auVar29) ^ auVar100;
                  auVar48 = packssdw(auVar48,auVar48);
                  if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    psVar13[uVar15 * 4 + -0x1c] = sVar7;
                  }
                  auVar50 = auVar49 & auVar75 | auVar50;
                  auVar48 = packssdw(auVar50,auVar50);
                  auVar48 = packssdw(auVar48 ^ auVar100,auVar48 ^ auVar100);
                  if ((auVar48._0_4_ >> 0x10 & 1) != 0) {
                    psVar13[uVar15 * 4 + -0x18] = sVar7;
                  }
                  auVar48 = (auVar24 | _DAT_0015b0d0) ^ auVar93;
                  iVar84 = -(uint)(iVar14 < auVar48._0_4_);
                  auVar89._4_4_ = -(uint)(iVar32 < auVar48._4_4_);
                  iVar92 = -(uint)(iVar33 < auVar48._8_4_);
                  auVar89._12_4_ = -(uint)(iVar34 < auVar48._12_4_);
                  auVar51._4_4_ = iVar84;
                  auVar51._0_4_ = iVar84;
                  auVar51._8_4_ = iVar92;
                  auVar51._12_4_ = iVar92;
                  auVar76._4_4_ = -(uint)(auVar48._4_4_ == iVar32);
                  auVar76._12_4_ = -(uint)(auVar48._12_4_ == iVar34);
                  auVar76._0_4_ = auVar76._4_4_;
                  auVar76._8_4_ = auVar76._12_4_;
                  auVar89._0_4_ = auVar89._4_4_;
                  auVar89._8_4_ = auVar89._12_4_;
                  auVar48 = auVar76 & auVar51 | auVar89;
                  auVar48 = packssdw(auVar48,auVar48);
                  auVar48 = packssdw(auVar48 ^ auVar100,auVar48 ^ auVar100);
                  if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    psVar13[uVar15 * 4 + -0x14] = sVar7;
                  }
                  auVar52 = pshufhw(auVar51,auVar51,0x84);
                  auVar27 = pshufhw(auVar76,auVar76,0x84);
                  auVar53 = pshufhw(auVar52,auVar89,0x84);
                  auVar52 = (auVar53 | auVar27 & auVar52) ^ auVar100;
                  auVar52 = packssdw(auVar52,auVar52);
                  if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    psVar13[uVar15 * 4 + -0x10] = sVar7;
                  }
                  auVar52 = (auVar24 | _DAT_0015fce0) ^ auVar93;
                  iVar84 = -(uint)(iVar14 < auVar52._0_4_);
                  auVar55._4_4_ = -(uint)(iVar32 < auVar52._4_4_);
                  iVar92 = -(uint)(iVar33 < auVar52._8_4_);
                  auVar55._12_4_ = -(uint)(iVar34 < auVar52._12_4_);
                  auVar77._4_4_ = iVar84;
                  auVar77._0_4_ = iVar84;
                  auVar77._8_4_ = iVar92;
                  auVar77._12_4_ = iVar92;
                  auVar48 = pshuflw(auVar48,auVar77,0xe8);
                  auVar54._4_4_ = -(uint)(auVar52._4_4_ == iVar32);
                  auVar54._12_4_ = -(uint)(auVar52._12_4_ == iVar34);
                  auVar54._0_4_ = auVar54._4_4_;
                  auVar54._8_4_ = auVar54._12_4_;
                  in_XMM6 = pshuflw(auVar98 & auVar29,auVar54,0xe8);
                  in_XMM6 = in_XMM6 & auVar48;
                  auVar55._0_4_ = auVar55._4_4_;
                  auVar55._8_4_ = auVar55._12_4_;
                  auVar29 = pshuflw(auVar48,auVar55,0xe8);
                  auVar29 = (auVar29 | in_XMM6) ^ auVar100;
                  in_XMM5 = packssdw(auVar29,auVar29);
                  if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    psVar13[uVar15 * 4 + -0xc] = sVar7;
                  }
                  auVar55 = auVar54 & auVar77 | auVar55;
                  auVar29 = packssdw(auVar55,auVar55);
                  auVar29 = packssdw(auVar29 ^ auVar100,auVar29 ^ auVar100);
                  if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                    psVar13[uVar15 * 4 + -8] = sVar7;
                  }
                  auVar29 = (auVar24 | _DAT_0015fcd0) ^ auVar93;
                  auVar78._0_4_ = -(uint)(iVar14 < auVar29._0_4_);
                  auVar78._4_4_ = -(uint)(iVar32 < auVar29._4_4_);
                  auVar78._8_4_ = -(uint)(iVar33 < auVar29._8_4_);
                  auVar78._12_4_ = -(uint)(iVar34 < auVar29._12_4_);
                  auVar56._4_4_ = auVar78._0_4_;
                  auVar56._0_4_ = auVar78._0_4_;
                  auVar56._8_4_ = auVar78._8_4_;
                  auVar56._12_4_ = auVar78._8_4_;
                  auVar25._4_4_ = -(uint)(auVar29._4_4_ == iVar32);
                  auVar25._12_4_ = -(uint)(auVar29._12_4_ == iVar34);
                  auVar25._0_4_ = auVar25._4_4_;
                  auVar25._8_4_ = auVar25._12_4_;
                  auVar30._4_4_ = auVar78._4_4_;
                  auVar30._0_4_ = auVar78._4_4_;
                  auVar30._8_4_ = auVar78._12_4_;
                  auVar30._12_4_ = auVar78._12_4_;
                  auVar29 = packssdw(auVar78,auVar25 & auVar56 | auVar30);
                  auVar29 = packssdw(auVar29 ^ auVar100,auVar29 ^ auVar100);
                  if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                    psVar13[uVar15 * 4 + -4] = sVar7;
                  }
                  auVar98 = pshufhw(auVar56,auVar56,0x84);
                  auVar29 = pshufhw(auVar25,auVar25,0x84);
                  auVar48 = pshufhw(auVar30,auVar30,0x84);
                  auVar29 = packssdw(auVar29 & auVar98,(auVar48 | auVar29 & auVar98) ^ auVar100);
                  if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                    psVar13[uVar15 * 4] = sVar7;
                  }
                  uVar15 = uVar15 + 8;
                } while ((pixelCount + 7 & 0xfffffff8) != uVar15);
              }
            }
            else if (0 < (int)pixelCount) {
              cVar6 = -(uVar16 == 3);
              uVar15 = 0;
              do {
                auVar29._8_4_ = (int)uVar15;
                auVar29._0_8_ = uVar15;
                auVar29._12_4_ = (int)(uVar15 >> 0x20);
                auVar48 = auVar23 ^ auVar93;
                auVar98 = (auVar29 | _DAT_0015b0b0) ^ auVar93;
                iVar14 = auVar48._0_4_;
                iVar84 = -(uint)(iVar14 < auVar98._0_4_);
                iVar32 = auVar48._4_4_;
                auVar52._4_4_ = -(uint)(iVar32 < auVar98._4_4_);
                iVar33 = auVar48._8_4_;
                iVar92 = -(uint)(iVar33 < auVar98._8_4_);
                iVar34 = auVar48._12_4_;
                auVar52._12_4_ = -(uint)(iVar34 < auVar98._12_4_);
                auVar53._4_4_ = iVar84;
                auVar53._0_4_ = iVar84;
                auVar53._8_4_ = iVar92;
                auVar53._12_4_ = iVar92;
                auVar27 = pshuflw(in_XMM5,auVar53,0xe8);
                auVar48._4_4_ = -(uint)(auVar98._4_4_ == iVar32);
                auVar48._12_4_ = -(uint)(auVar98._12_4_ == iVar34);
                auVar48._0_4_ = auVar48._4_4_;
                auVar48._8_4_ = auVar48._12_4_;
                auVar35 = pshuflw(in_XMM6,auVar48,0xe8);
                auVar52._0_4_ = auVar52._4_4_;
                auVar52._8_4_ = auVar52._12_4_;
                auVar98 = pshuflw(auVar27,auVar52,0xe8);
                auVar98 = (auVar98 | auVar35 & auVar27) ^ auVar100;
                auVar98 = packssdw(auVar98,auVar98);
                if ((auVar98 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x1e) = cVar6;
                }
                auVar52 = auVar48 & auVar53 | auVar52;
                auVar48 = packssdw(auVar52,auVar52);
                auVar48 = packssdw(auVar48 ^ auVar100,auVar48 ^ auVar100);
                auVar48 = packsswb(auVar48,auVar48);
                if ((auVar48._0_4_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x1c) = cVar6;
                }
                auVar48 = (auVar29 | _DAT_0015b0d0) ^ auVar93;
                iVar84 = -(uint)(iVar14 < auVar48._0_4_);
                auVar68._4_4_ = -(uint)(iVar32 < auVar48._4_4_);
                iVar92 = -(uint)(iVar33 < auVar48._8_4_);
                auVar68._12_4_ = -(uint)(iVar34 < auVar48._12_4_);
                auVar98._4_4_ = iVar84;
                auVar98._0_4_ = iVar84;
                auVar98._8_4_ = iVar92;
                auVar98._12_4_ = iVar92;
                auVar94._4_4_ = -(uint)(auVar48._4_4_ == iVar32);
                auVar94._12_4_ = -(uint)(auVar48._12_4_ == iVar34);
                auVar94._0_4_ = auVar94._4_4_;
                auVar94._8_4_ = auVar94._12_4_;
                auVar68._0_4_ = auVar68._4_4_;
                auVar68._8_4_ = auVar68._12_4_;
                auVar48 = auVar94 & auVar98 | auVar68;
                auVar48 = packssdw(auVar48,auVar48);
                auVar48 = packssdw(auVar48 ^ auVar100,auVar48 ^ auVar100);
                auVar48 = packsswb(auVar48,auVar48);
                if ((auVar48._0_4_ >> 0x10 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x1a) = cVar6;
                }
                auVar98 = pshufhw(auVar98,auVar98,0x84);
                auVar53 = pshufhw(auVar94,auVar94,0x84);
                auVar52 = pshufhw(auVar98,auVar68,0x84);
                auVar98 = (auVar52 | auVar53 & auVar98) ^ auVar100;
                auVar98 = packssdw(auVar98,auVar98);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98._0_4_ >> 0x18 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x18) = cVar6;
                }
                auVar98 = (auVar29 | _DAT_0015fce0) ^ auVar93;
                iVar84 = -(uint)(iVar14 < auVar98._0_4_);
                auVar58._4_4_ = -(uint)(iVar32 < auVar98._4_4_);
                iVar92 = -(uint)(iVar33 < auVar98._8_4_);
                auVar58._12_4_ = -(uint)(iVar34 < auVar98._12_4_);
                auVar79._4_4_ = iVar84;
                auVar79._0_4_ = iVar84;
                auVar79._8_4_ = iVar92;
                auVar79._12_4_ = iVar92;
                auVar48 = pshuflw(auVar48,auVar79,0xe8);
                auVar57._4_4_ = -(uint)(auVar98._4_4_ == iVar32);
                auVar57._12_4_ = -(uint)(auVar98._12_4_ == iVar34);
                auVar57._0_4_ = auVar57._4_4_;
                auVar57._8_4_ = auVar57._12_4_;
                auVar52 = pshuflw(auVar35 & auVar27,auVar57,0xe8);
                auVar58._0_4_ = auVar58._4_4_;
                auVar58._8_4_ = auVar58._12_4_;
                auVar98 = pshuflw(auVar48,auVar58,0xe8);
                auVar98 = (auVar98 | auVar52 & auVar48) ^ auVar100;
                auVar98 = packssdw(auVar98,auVar98);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x16) = cVar6;
                }
                auVar58 = auVar57 & auVar79 | auVar58;
                auVar98 = packssdw(auVar58,auVar58);
                auVar98 = packssdw(auVar98 ^ auVar100,auVar98 ^ auVar100);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98._4_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x14) = cVar6;
                }
                auVar98 = (auVar29 | _DAT_0015fcd0) ^ auVar93;
                iVar84 = -(uint)(iVar14 < auVar98._0_4_);
                auVar90._4_4_ = -(uint)(iVar32 < auVar98._4_4_);
                iVar92 = -(uint)(iVar33 < auVar98._8_4_);
                auVar90._12_4_ = -(uint)(iVar34 < auVar98._12_4_);
                auVar27._4_4_ = iVar84;
                auVar27._0_4_ = iVar84;
                auVar27._8_4_ = iVar92;
                auVar27._12_4_ = iVar92;
                auVar35._4_4_ = -(uint)(auVar98._4_4_ == iVar32);
                auVar35._12_4_ = -(uint)(auVar98._12_4_ == iVar34);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                auVar90._0_4_ = auVar90._4_4_;
                auVar90._8_4_ = auVar90._12_4_;
                auVar98 = auVar35 & auVar27 | auVar90;
                auVar98 = packssdw(auVar98,auVar98);
                auVar98 = packssdw(auVar98 ^ auVar100,auVar98 ^ auVar100);
                auVar98 = packsswb(auVar98,auVar98);
                if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x12) = cVar6;
                }
                auVar53 = pshufhw(auVar27,auVar27,0x84);
                auVar35 = pshufhw(auVar35,auVar35,0x84);
                auVar27 = pshufhw(auVar53,auVar90,0x84);
                auVar53 = (auVar27 | auVar35 & auVar53) ^ auVar100;
                auVar53 = packssdw(auVar53,auVar53);
                auVar53 = packsswb(auVar53,auVar53);
                if ((auVar53._6_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x10) = cVar6;
                }
                auVar53 = (auVar29 | _DAT_0015fcc0) ^ auVar93;
                iVar84 = -(uint)(iVar14 < auVar53._0_4_);
                auVar60._4_4_ = -(uint)(iVar32 < auVar53._4_4_);
                iVar92 = -(uint)(iVar33 < auVar53._8_4_);
                auVar60._12_4_ = -(uint)(iVar34 < auVar53._12_4_);
                auVar80._4_4_ = iVar84;
                auVar80._0_4_ = iVar84;
                auVar80._8_4_ = iVar92;
                auVar80._12_4_ = iVar92;
                auVar98 = pshuflw(auVar98,auVar80,0xe8);
                auVar59._4_4_ = -(uint)(auVar53._4_4_ == iVar32);
                auVar59._12_4_ = -(uint)(auVar53._12_4_ == iVar34);
                auVar59._0_4_ = auVar59._4_4_;
                auVar59._8_4_ = auVar59._12_4_;
                auVar52 = pshuflw(auVar52 & auVar48,auVar59,0xe8);
                auVar60._0_4_ = auVar60._4_4_;
                auVar60._8_4_ = auVar60._12_4_;
                auVar48 = pshuflw(auVar98,auVar60,0xe8);
                auVar48 = (auVar48 | auVar52 & auVar98) ^ auVar100;
                auVar48 = packssdw(auVar48,auVar48);
                auVar48 = packsswb(auVar48,auVar48);
                if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0xe) = cVar6;
                }
                auVar60 = auVar59 & auVar80 | auVar60;
                auVar48 = packssdw(auVar60,auVar60);
                auVar48 = packssdw(auVar48 ^ auVar100,auVar48 ^ auVar100);
                auVar48 = packsswb(auVar48,auVar48);
                if ((auVar48._8_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0xc) = cVar6;
                }
                auVar48 = (auVar29 | _DAT_0015fcb0) ^ auVar93;
                iVar84 = -(uint)(iVar14 < auVar48._0_4_);
                auVar91._4_4_ = -(uint)(iVar32 < auVar48._4_4_);
                iVar92 = -(uint)(iVar33 < auVar48._8_4_);
                auVar91._12_4_ = -(uint)(iVar34 < auVar48._12_4_);
                auVar61._4_4_ = iVar84;
                auVar61._0_4_ = iVar84;
                auVar61._8_4_ = iVar92;
                auVar61._12_4_ = iVar92;
                auVar81._4_4_ = -(uint)(auVar48._4_4_ == iVar32);
                auVar81._12_4_ = -(uint)(auVar48._12_4_ == iVar34);
                auVar81._0_4_ = auVar81._4_4_;
                auVar81._8_4_ = auVar81._12_4_;
                auVar91._0_4_ = auVar91._4_4_;
                auVar91._8_4_ = auVar91._12_4_;
                auVar48 = auVar81 & auVar61 | auVar91;
                auVar48 = packssdw(auVar48,auVar48);
                auVar48 = packssdw(auVar48 ^ auVar100,auVar48 ^ auVar100);
                auVar48 = packsswb(auVar48,auVar48);
                if ((auVar48 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -10) = cVar6;
                }
                auVar53 = pshufhw(auVar61,auVar61,0x84);
                auVar35 = pshufhw(auVar81,auVar81,0x84);
                auVar27 = pshufhw(auVar53,auVar91,0x84);
                auVar53 = (auVar27 | auVar35 & auVar53) ^ auVar100;
                auVar53 = packssdw(auVar53,auVar53);
                auVar53 = packsswb(auVar53,auVar53);
                if ((auVar53._10_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -8) = cVar6;
                }
                auVar53 = (auVar29 | _DAT_0015fca0) ^ auVar93;
                iVar84 = -(uint)(iVar14 < auVar53._0_4_);
                auVar63._4_4_ = -(uint)(iVar32 < auVar53._4_4_);
                iVar92 = -(uint)(iVar33 < auVar53._8_4_);
                auVar63._12_4_ = -(uint)(iVar34 < auVar53._12_4_);
                auVar82._4_4_ = iVar84;
                auVar82._0_4_ = iVar84;
                auVar82._8_4_ = iVar92;
                auVar82._12_4_ = iVar92;
                auVar48 = pshuflw(auVar48,auVar82,0xe8);
                auVar62._4_4_ = -(uint)(auVar53._4_4_ == iVar32);
                auVar62._12_4_ = -(uint)(auVar53._12_4_ == iVar34);
                auVar62._0_4_ = auVar62._4_4_;
                auVar62._8_4_ = auVar62._12_4_;
                in_XMM6 = pshuflw(auVar52 & auVar98,auVar62,0xe8);
                in_XMM6 = in_XMM6 & auVar48;
                auVar63._0_4_ = auVar63._4_4_;
                auVar63._8_4_ = auVar63._12_4_;
                auVar48 = pshuflw(auVar48,auVar63,0xe8);
                auVar48 = (auVar48 | in_XMM6) ^ auVar100;
                auVar48 = packssdw(auVar48,auVar48);
                in_XMM5 = packsswb(auVar48,auVar48);
                if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -6) = cVar6;
                }
                auVar63 = auVar62 & auVar82 | auVar63;
                auVar48 = packssdw(auVar63,auVar63);
                auVar48 = packssdw(auVar48 ^ auVar100,auVar48 ^ auVar100);
                auVar48 = packsswb(auVar48,auVar48);
                if ((auVar48._12_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -4) = cVar6;
                }
                auVar29 = (auVar29 | _DAT_0015fc90) ^ auVar93;
                auVar83._0_4_ = -(uint)(iVar14 < auVar29._0_4_);
                auVar83._4_4_ = -(uint)(iVar32 < auVar29._4_4_);
                auVar83._8_4_ = -(uint)(iVar33 < auVar29._8_4_);
                auVar83._12_4_ = -(uint)(iVar34 < auVar29._12_4_);
                auVar64._4_4_ = auVar83._0_4_;
                auVar64._0_4_ = auVar83._0_4_;
                auVar64._8_4_ = auVar83._8_4_;
                auVar64._12_4_ = auVar83._8_4_;
                auVar26._4_4_ = -(uint)(auVar29._4_4_ == iVar32);
                auVar26._12_4_ = -(uint)(auVar29._12_4_ == iVar34);
                auVar26._0_4_ = auVar26._4_4_;
                auVar26._8_4_ = auVar26._12_4_;
                auVar31._4_4_ = auVar83._4_4_;
                auVar31._0_4_ = auVar83._4_4_;
                auVar31._8_4_ = auVar83._12_4_;
                auVar31._12_4_ = auVar83._12_4_;
                auVar29 = packssdw(auVar83,auVar26 & auVar64 | auVar31);
                auVar29 = packssdw(auVar29 ^ auVar100,auVar29 ^ auVar100);
                auVar29 = packsswb(auVar29,auVar29);
                if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -2) = cVar6;
                }
                auVar98 = pshufhw(auVar64,auVar64,0x84);
                auVar29 = pshufhw(auVar26,auVar26,0x84);
                auVar48 = pshufhw(auVar31,auVar31,0x84);
                auVar29 = packssdw(auVar29 & auVar98,(auVar48 | auVar29 & auVar98) ^ auVar100);
                auVar29 = packsswb(auVar29,auVar29);
                if ((auVar29._14_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2) = cVar6;
                }
                uVar15 = uVar15 + 0x10;
              } while ((pixelCount + 0xf & 0xfffffff0) != uVar15);
            }
            uVar16 = uVar16 + 1;
            psVar18 = (stbi__uint16 *)((long)psVar18 + 1);
            psVar13 = psVar13 + 1;
            local_80 = (stbi__uint16 *)((long)local_80 + 1);
            local_70 = local_70 + 1;
          } while (uVar16 != 4);
        }
        else {
          stbi__skip(s,bVar5 * sVar8 * 2);
          lVar19 = uVar17 - 1;
          auVar99._8_4_ = (int)lVar19;
          auVar99._0_8_ = lVar19;
          auVar99._12_4_ = (int)((ulong)lVar19 >> 0x20);
          psVar18 = data + 0x1e;
          uVar16 = 0;
          auVar93 = _DAT_0015fc90;
          auVar23 = _DAT_0015fca0;
          auVar100 = _DAT_0015fcb0;
          auVar29 = _DAT_0015fcc0;
          auVar48 = _DAT_0015fcd0;
          auVar98 = _DAT_0015fce0;
          auVar52 = _DAT_0015b0d0;
          auVar53 = _DAT_0015b0b0;
          do {
            if (uVar16 < uVar20) {
              iVar14 = stbi__psd_decode_rle(s,(stbi_uc *)((long)data + uVar16),pixelCount);
              auVar93 = _DAT_0015fc90;
              auVar23 = _DAT_0015fca0;
              auVar100 = _DAT_0015fcb0;
              auVar29 = _DAT_0015fcc0;
              auVar48 = _DAT_0015fcd0;
              auVar98 = _DAT_0015fce0;
              auVar52 = _DAT_0015b0d0;
              auVar53 = _DAT_0015b0b0;
              if (iVar14 == 0) {
                free(data);
                pcVar12 = "corrupt";
                goto LAB_00135d2f;
              }
            }
            else if (0 < (int)pixelCount) {
              cVar6 = -(uVar16 == 3);
              uVar15 = 0;
              do {
                auVar21._8_4_ = (int)uVar15;
                auVar21._0_8_ = uVar15;
                auVar21._12_4_ = (int)(uVar15 >> 0x20);
                auVar27 = auVar99 ^ _DAT_0015b090;
                auVar35 = (auVar21 | auVar53) ^ _DAT_0015b090;
                iVar14 = auVar27._0_4_;
                iVar84 = -(uint)(iVar14 < auVar35._0_4_);
                iVar32 = auVar27._4_4_;
                auVar37._4_4_ = -(uint)(iVar32 < auVar35._4_4_);
                iVar33 = auVar27._8_4_;
                iVar92 = -(uint)(iVar33 < auVar35._8_4_);
                iVar34 = auVar27._12_4_;
                auVar37._12_4_ = -(uint)(iVar34 < auVar35._12_4_);
                auVar66._4_4_ = iVar84;
                auVar66._0_4_ = iVar84;
                auVar66._8_4_ = iVar92;
                auVar66._12_4_ = iVar92;
                auVar27 = pshuflw(in_XMM5,auVar66,0xe8);
                auVar36._4_4_ = -(uint)(auVar35._4_4_ == iVar32);
                auVar36._12_4_ = -(uint)(auVar35._12_4_ == iVar34);
                auVar36._0_4_ = auVar36._4_4_;
                auVar36._8_4_ = auVar36._12_4_;
                auVar94 = pshuflw(in_XMM6,auVar36,0xe8);
                auVar37._0_4_ = auVar37._4_4_;
                auVar37._8_4_ = auVar37._12_4_;
                auVar35 = pshuflw(auVar27,auVar37,0xe8);
                auVar95._8_4_ = 0xffffffff;
                auVar95._0_8_ = 0xffffffffffffffff;
                auVar95._12_4_ = 0xffffffff;
                auVar27 = (auVar35 | auVar94 & auVar27) ^ auVar95;
                auVar27 = packssdw(auVar27,auVar27);
                if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x1e) = cVar6;
                }
                auVar37 = auVar36 & auVar66 | auVar37;
                auVar27 = packssdw(auVar37,auVar37);
                auVar27 = packssdw(auVar27 ^ auVar95,auVar27 ^ auVar95);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27._0_4_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x1c) = cVar6;
                }
                auVar27 = (auVar21 | auVar52) ^ _DAT_0015b090;
                iVar84 = -(uint)(iVar14 < auVar27._0_4_);
                auVar86._4_4_ = -(uint)(iVar32 < auVar27._4_4_);
                iVar92 = -(uint)(iVar33 < auVar27._8_4_);
                auVar86._12_4_ = -(uint)(iVar34 < auVar27._12_4_);
                auVar38._4_4_ = iVar84;
                auVar38._0_4_ = iVar84;
                auVar38._8_4_ = iVar92;
                auVar38._12_4_ = iVar92;
                auVar67._4_4_ = -(uint)(auVar27._4_4_ == iVar32);
                auVar67._12_4_ = -(uint)(auVar27._12_4_ == iVar34);
                auVar67._0_4_ = auVar67._4_4_;
                auVar67._8_4_ = auVar67._12_4_;
                auVar86._0_4_ = auVar86._4_4_;
                auVar86._8_4_ = auVar86._12_4_;
                auVar27 = auVar67 & auVar38 | auVar86;
                auVar27 = packssdw(auVar27,auVar27);
                auVar27 = packssdw(auVar27 ^ auVar95,auVar27 ^ auVar95);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x1a) = cVar6;
                }
                auVar35 = pshufhw(auVar38,auVar38,0x84);
                auVar68 = pshufhw(auVar67,auVar67,0x84);
                auVar94 = pshufhw(auVar35,auVar86,0x84);
                auVar35 = (auVar94 | auVar68 & auVar35) ^ auVar95;
                auVar35 = packssdw(auVar35,auVar35);
                auVar35 = packsswb(auVar35,auVar35);
                if ((auVar35._0_4_ >> 0x18 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x18) = cVar6;
                }
                auVar35 = (auVar21 | auVar98) ^ _DAT_0015b090;
                iVar84 = -(uint)(iVar14 < auVar35._0_4_);
                auVar40._4_4_ = -(uint)(iVar32 < auVar35._4_4_);
                iVar92 = -(uint)(iVar33 < auVar35._8_4_);
                auVar40._12_4_ = -(uint)(iVar34 < auVar35._12_4_);
                auVar69._4_4_ = iVar84;
                auVar69._0_4_ = iVar84;
                auVar69._8_4_ = iVar92;
                auVar69._12_4_ = iVar92;
                auVar27 = pshuflw(auVar27,auVar69,0xe8);
                auVar39._4_4_ = -(uint)(auVar35._4_4_ == iVar32);
                auVar39._12_4_ = -(uint)(auVar35._12_4_ == iVar34);
                auVar39._0_4_ = auVar39._4_4_;
                auVar39._8_4_ = auVar39._12_4_;
                auVar94 = pshuflw(auVar95,auVar39,0xe8);
                auVar40._0_4_ = auVar40._4_4_;
                auVar40._8_4_ = auVar40._12_4_;
                auVar35 = pshuflw(auVar27,auVar40,0xe8);
                auVar96._8_4_ = 0xffffffff;
                auVar96._0_8_ = 0xffffffffffffffff;
                auVar96._12_4_ = 0xffffffff;
                auVar27 = (auVar35 | auVar94 & auVar27) ^ auVar96;
                auVar27 = packssdw(auVar27,auVar27);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x16) = cVar6;
                }
                auVar40 = auVar39 & auVar69 | auVar40;
                auVar27 = packssdw(auVar40,auVar40);
                auVar27 = packssdw(auVar27 ^ auVar96,auVar27 ^ auVar96);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27._4_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x14) = cVar6;
                }
                auVar27 = (auVar21 | auVar48) ^ _DAT_0015b090;
                iVar84 = -(uint)(iVar14 < auVar27._0_4_);
                auVar87._4_4_ = -(uint)(iVar32 < auVar27._4_4_);
                iVar92 = -(uint)(iVar33 < auVar27._8_4_);
                auVar87._12_4_ = -(uint)(iVar34 < auVar27._12_4_);
                auVar41._4_4_ = iVar84;
                auVar41._0_4_ = iVar84;
                auVar41._8_4_ = iVar92;
                auVar41._12_4_ = iVar92;
                auVar70._4_4_ = -(uint)(auVar27._4_4_ == iVar32);
                auVar70._12_4_ = -(uint)(auVar27._12_4_ == iVar34);
                auVar70._0_4_ = auVar70._4_4_;
                auVar70._8_4_ = auVar70._12_4_;
                auVar87._0_4_ = auVar87._4_4_;
                auVar87._8_4_ = auVar87._12_4_;
                auVar27 = auVar70 & auVar41 | auVar87;
                auVar27 = packssdw(auVar27,auVar27);
                auVar27 = packssdw(auVar27 ^ auVar96,auVar27 ^ auVar96);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x12) = cVar6;
                }
                auVar35 = pshufhw(auVar41,auVar41,0x84);
                auVar68 = pshufhw(auVar70,auVar70,0x84);
                auVar94 = pshufhw(auVar35,auVar87,0x84);
                auVar35 = (auVar94 | auVar68 & auVar35) ^ auVar96;
                auVar35 = packssdw(auVar35,auVar35);
                auVar35 = packsswb(auVar35,auVar35);
                if ((auVar35._6_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0x10) = cVar6;
                }
                auVar35 = (auVar21 | auVar29) ^ _DAT_0015b090;
                iVar84 = -(uint)(iVar14 < auVar35._0_4_);
                auVar43._4_4_ = -(uint)(iVar32 < auVar35._4_4_);
                iVar92 = -(uint)(iVar33 < auVar35._8_4_);
                auVar43._12_4_ = -(uint)(iVar34 < auVar35._12_4_);
                auVar71._4_4_ = iVar84;
                auVar71._0_4_ = iVar84;
                auVar71._8_4_ = iVar92;
                auVar71._12_4_ = iVar92;
                auVar27 = pshuflw(auVar27,auVar71,0xe8);
                auVar42._4_4_ = -(uint)(auVar35._4_4_ == iVar32);
                auVar42._12_4_ = -(uint)(auVar35._12_4_ == iVar34);
                auVar42._0_4_ = auVar42._4_4_;
                auVar42._8_4_ = auVar42._12_4_;
                auVar94 = pshuflw(auVar96,auVar42,0xe8);
                auVar43._0_4_ = auVar43._4_4_;
                auVar43._8_4_ = auVar43._12_4_;
                auVar35 = pshuflw(auVar27,auVar43,0xe8);
                auVar97._8_4_ = 0xffffffff;
                auVar97._0_8_ = 0xffffffffffffffff;
                auVar97._12_4_ = 0xffffffff;
                auVar27 = (auVar35 | auVar94 & auVar27) ^ auVar97;
                auVar27 = packssdw(auVar27,auVar27);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0xe) = cVar6;
                }
                auVar43 = auVar42 & auVar71 | auVar43;
                auVar27 = packssdw(auVar43,auVar43);
                auVar27 = packssdw(auVar27 ^ auVar97,auVar27 ^ auVar97);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27._8_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -0xc) = cVar6;
                }
                auVar27 = (auVar21 | auVar100) ^ _DAT_0015b090;
                iVar84 = -(uint)(iVar14 < auVar27._0_4_);
                auVar88._4_4_ = -(uint)(iVar32 < auVar27._4_4_);
                iVar92 = -(uint)(iVar33 < auVar27._8_4_);
                auVar88._12_4_ = -(uint)(iVar34 < auVar27._12_4_);
                auVar44._4_4_ = iVar84;
                auVar44._0_4_ = iVar84;
                auVar44._8_4_ = iVar92;
                auVar44._12_4_ = iVar92;
                auVar72._4_4_ = -(uint)(auVar27._4_4_ == iVar32);
                auVar72._12_4_ = -(uint)(auVar27._12_4_ == iVar34);
                auVar72._0_4_ = auVar72._4_4_;
                auVar72._8_4_ = auVar72._12_4_;
                auVar88._0_4_ = auVar88._4_4_;
                auVar88._8_4_ = auVar88._12_4_;
                auVar27 = auVar72 & auVar44 | auVar88;
                auVar27 = packssdw(auVar27,auVar27);
                auVar27 = packssdw(auVar27 ^ auVar97,auVar27 ^ auVar97);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -10) = cVar6;
                }
                auVar35 = pshufhw(auVar44,auVar44,0x84);
                auVar68 = pshufhw(auVar72,auVar72,0x84);
                auVar94 = pshufhw(auVar35,auVar88,0x84);
                auVar35 = (auVar94 | auVar68 & auVar35) ^ auVar97;
                auVar35 = packssdw(auVar35,auVar35);
                auVar35 = packsswb(auVar35,auVar35);
                if ((auVar35._10_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -8) = cVar6;
                }
                auVar35 = (auVar21 | auVar23) ^ _DAT_0015b090;
                iVar84 = -(uint)(iVar14 < auVar35._0_4_);
                auVar46._4_4_ = -(uint)(iVar32 < auVar35._4_4_);
                iVar92 = -(uint)(iVar33 < auVar35._8_4_);
                auVar46._12_4_ = -(uint)(iVar34 < auVar35._12_4_);
                auVar73._4_4_ = iVar84;
                auVar73._0_4_ = iVar84;
                auVar73._8_4_ = iVar92;
                auVar73._12_4_ = iVar92;
                auVar27 = pshuflw(auVar27,auVar73,0xe8);
                auVar45._4_4_ = -(uint)(auVar35._4_4_ == iVar32);
                auVar45._12_4_ = -(uint)(auVar35._12_4_ == iVar34);
                auVar45._0_4_ = auVar45._4_4_;
                auVar45._8_4_ = auVar45._12_4_;
                auVar94 = pshuflw(auVar97,auVar45,0xe8);
                auVar46._0_4_ = auVar46._4_4_;
                auVar46._8_4_ = auVar46._12_4_;
                auVar35 = pshuflw(auVar27,auVar46,0xe8);
                in_XMM6._8_4_ = 0xffffffff;
                in_XMM6._0_8_ = 0xffffffffffffffff;
                in_XMM6._12_4_ = 0xffffffff;
                auVar27 = (auVar35 | auVar94 & auVar27) ^ in_XMM6;
                auVar27 = packssdw(auVar27,auVar27);
                in_XMM5 = packsswb(auVar27,auVar27);
                if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -6) = cVar6;
                }
                auVar46 = auVar45 & auVar73 | auVar46;
                auVar27 = packssdw(auVar46,auVar46);
                auVar27 = packssdw(auVar27 ^ in_XMM6,auVar27 ^ in_XMM6);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27._12_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2 + -4) = cVar6;
                }
                auVar27 = (auVar21 | auVar93) ^ _DAT_0015b090;
                auVar74._0_4_ = -(uint)(iVar14 < auVar27._0_4_);
                auVar74._4_4_ = -(uint)(iVar32 < auVar27._4_4_);
                auVar74._8_4_ = -(uint)(iVar33 < auVar27._8_4_);
                auVar74._12_4_ = -(uint)(iVar34 < auVar27._12_4_);
                auVar47._4_4_ = auVar74._0_4_;
                auVar47._0_4_ = auVar74._0_4_;
                auVar47._8_4_ = auVar74._8_4_;
                auVar47._12_4_ = auVar74._8_4_;
                auVar22._4_4_ = -(uint)(auVar27._4_4_ == iVar32);
                auVar22._12_4_ = -(uint)(auVar27._12_4_ == iVar34);
                auVar22._0_4_ = auVar22._4_4_;
                auVar22._8_4_ = auVar22._12_4_;
                auVar28._4_4_ = auVar74._4_4_;
                auVar28._0_4_ = auVar74._4_4_;
                auVar28._8_4_ = auVar74._12_4_;
                auVar28._12_4_ = auVar74._12_4_;
                auVar27 = packssdw(auVar74,auVar22 & auVar47 | auVar28);
                auVar27 = packssdw(auVar27 ^ in_XMM6,auVar27 ^ in_XMM6);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(char *)(psVar18 + uVar15 * 2 + -2) = cVar6;
                }
                auVar94 = pshufhw(auVar47,auVar47,0x84);
                auVar27 = pshufhw(auVar22,auVar22,0x84);
                auVar35 = pshufhw(auVar28,auVar28,0x84);
                auVar27 = packssdw(auVar27 & auVar94,(auVar35 | auVar27 & auVar94) ^ in_XMM6);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27._14_2_ >> 8 & 1) != 0) {
                  *(char *)(psVar18 + uVar15 * 2) = cVar6;
                }
                uVar15 = uVar15 + 0x10;
              } while ((pixelCount + 0xf & 0xfffffff0) != uVar15);
            }
            uVar16 = uVar16 + 1;
            psVar18 = (stbi__uint16 *)((long)psVar18 + 1);
          } while (uVar16 != 4);
        }
        if (3 < uVar20) {
          if (ri->bits_per_channel == 0x10) {
            if (0 < (int)pixelCount) {
              uVar16 = 0;
              do {
                uVar1 = data[uVar16 * 4 + 3];
                if ((uVar1 != 0) && (uVar1 != 0xffff)) {
                  fVar85 = 1.0 / ((float)uVar1 / 65535.0);
                  fVar65 = (1.0 - fVar85) * 65535.0;
                  auVar93._0_4_ =
                       (int)(fVar65 + fVar85 * (float)(*(uint *)(data + uVar16 * 4) & 0xffff));
                  auVar93._4_4_ =
                       (int)(fVar65 + fVar85 * (float)(*(uint *)(data + uVar16 * 4) >> 0x10));
                  auVar93._8_4_ = (int)(fVar65 + fVar85 * 0.0);
                  auVar93._12_4_ = (int)(fVar65 + fVar85 * 0.0);
                  auVar93 = pshuflw(auVar93,auVar93,0xe8);
                  *(int *)(data + uVar16 * 4) = auVar93._0_4_;
                  data[uVar16 * 4 + 2] =
                       (stbi__uint16)(int)((float)data[uVar16 * 4 + 2] * fVar85 + fVar65);
                }
                uVar16 = uVar16 + 1;
              } while (uVar17 != uVar16);
            }
          }
          else if (0 < (int)pixelCount) {
            uVar16 = 0;
            do {
              bVar5 = *(byte *)((long)data + uVar16 * 4 + 3);
              if ((bVar5 != 0) && (bVar5 != 0xff)) {
                fVar85 = 1.0 / ((float)bVar5 / 255.0);
                fVar65 = (1.0 - fVar85) * 255.0;
                *(char *)(data + uVar16 * 2) =
                     (char)(int)((float)(byte)data[uVar16 * 2] * fVar85 + fVar65);
                *(char *)((long)data + uVar16 * 4 + 1) =
                     (char)(int)((float)*(byte *)((long)data + uVar16 * 4 + 1) * fVar85 + fVar65);
                *(char *)(data + uVar16 * 2 + 1) =
                     (char)(int)((float)(byte)data[uVar16 * 2 + 1] * fVar85 + fVar65);
              }
              uVar16 = uVar16 + 1;
            } while (uVar17 != uVar16);
          }
        }
        if ((req_comp & 0xfffffffbU) != 0) {
          if (ri->bits_per_channel == 0x10) {
            data = stbi__convert_format16(data,4,req_comp,x_00,sVar8);
          }
          else {
            data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,sVar8);
          }
          if (data == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        if (comp != (int *)0x0) {
          *comp = 4;
        }
        *y = sVar8;
        *x = x_00;
        return data;
      }
      pcVar12 = "outofmem";
      goto LAB_00135d2f;
    }
  }
  pcVar12 = "too large";
LAB_00135d2f:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar12;
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   if (h > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (w > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}